

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3_prov.c
# Opt level: O0

int shake_set_ctx_params(void *vctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *p_00;
  long in_RSI;
  size_t *in_RDI;
  KECCAK1600_CTX *ctx;
  OSSL_PARAM *p;
  OSSL_PARAM *in_stack_ffffffffffffffe0;
  int line;
  size_t *file;
  int local_4;
  
  if (in_RDI == (size_t *)0x0) {
    local_4 = 0;
  }
  else if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    file = in_RDI;
    p_00 = OSSL_PARAM_locate_const(in_stack_ffffffffffffffe0,(char *)in_RDI);
    line = (int)((ulong)in_RSI >> 0x20);
    if ((p_00 != (OSSL_PARAM *)0x0) && (iVar1 = OSSL_PARAM_get_size_t(p_00,in_RDI), iVar1 == 0)) {
      ERR_new();
      ERR_set_debug((char *)file,line,(char *)p_00);
      ERR_set_error(0x39,0x67,(char *)0x0);
      return 0;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int shake_set_ctx_params(void *vctx, const OSSL_PARAM params[])
{
    const OSSL_PARAM *p;
    KECCAK1600_CTX *ctx = (KECCAK1600_CTX *)vctx;

    if (ctx == NULL)
        return 0;
    if (params == NULL)
        return 1;

    p = OSSL_PARAM_locate_const(params, OSSL_DIGEST_PARAM_XOFLEN);
    if (p != NULL && !OSSL_PARAM_get_size_t(p, &ctx->md_size)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_FAILED_TO_GET_PARAMETER);
        return 0;
    }
    return 1;
}